

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkLibrariesCommand.cxx
# Opt level: O2

bool __thiscall
cmTargetLinkLibrariesCommand::InitialPass
          (cmTargetLinkLibrariesCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  string *name;
  cmMakefile *pcVar1;
  LinkLibraryType right;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  PolicyStatus PVar6;
  cmake *pcVar7;
  cmTarget *pcVar8;
  ostream *poVar9;
  pointer pbVar10;
  char *pcVar11;
  LinkLibraryType llt;
  PolicyID id;
  PolicyID id_00;
  PolicyID id_01;
  MessageType t;
  pointer pbVar12;
  int iVar13;
  ulong uVar14;
  string local_1c8;
  ostringstream e;
  
  name = (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == name) {
    std::__cxx11::string::string
              ((string *)&e,"called with incorrect number of arguments",(allocator *)&local_1c8);
    cmCommand::SetError(&this->super_cmCommand,(string *)&e);
LAB_002ceccf:
    std::__cxx11::string::~string((string *)&e);
    return false;
  }
  bVar2 = cmMakefile::IsAlias((this->super_cmCommand).Makefile,name);
  if (bVar2) {
    std::__cxx11::string::string
              ((string *)&e,"can not be used on an ALIAS target.",(allocator *)&local_1c8);
    cmCommand::SetError(&this->super_cmCommand,(string *)&e);
    goto LAB_002ceccf;
  }
  pcVar7 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
  pcVar8 = cmGlobalGenerator::FindTarget
                     (pcVar7->GlobalGenerator,
                      (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start,false);
  this->Target = pcVar8;
  if (pcVar8 == (cmTarget *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar9 = std::operator<<((ostream *)&e,"Cannot specify link libraries for target \"");
    poVar9 = std::operator<<(poVar9,(string *)
                                    (args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start);
    poVar9 = std::operator<<(poVar9,"\" ");
    std::operator<<(poVar9,"which is not built by this project.");
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
               (long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start) < 0x21) {
      PVar6 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0016);
      if (PVar6 - REQUIRED_IF_USED < 2) {
        poVar9 = std::operator<<((ostream *)&e,"\n");
        cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_1c8,(cmPolicies *)&DAT_00000010,id_01);
        std::operator<<(poVar9,(string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
        goto LAB_002cf409;
      }
      if (PVar6 != OLD) {
        if (PVar6 != WARN) goto LAB_002cf409;
        poVar9 = std::operator<<((ostream *)&e,"\n");
        poVar9 = std::operator<<(poVar9,
                                 "CMake does not support this but it used to work accidentally ");
        poVar9 = std::operator<<(poVar9,"and is being allowed for compatibility.");
        poVar9 = std::operator<<(poVar9,"\n");
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c8,(cmPolicies *)&DAT_00000010,id);
        std::operator<<(poVar9,(string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
        pcVar1 = (this->super_cmCommand).Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
      }
    }
    else {
LAB_002cf409:
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c8);
LAB_002cf42c:
      std::__cxx11::string::~string((string *)&local_1c8);
      cmSystemTools::s_FatalErrorOccured = true;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  }
  else {
    if (pcVar8->TargetTypeValue == UTILITY) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      PVar6 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0039);
      if (PVar6 - NEW < 3) {
        t = FATAL_ERROR;
        bVar2 = true;
        pcVar11 = "must";
LAB_002cef15:
        poVar9 = std::operator<<((ostream *)&e,"Utility target \"");
        poVar9 = std::operator<<(poVar9,(string *)&this->Target->Name);
        poVar9 = std::operator<<(poVar9,"\" ");
        poVar9 = std::operator<<(poVar9,pcVar11);
        std::operator<<(poVar9," not be used as the target of a target_link_libraries call.");
        pcVar1 = (this->super_cmCommand).Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(pcVar1,t,&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
        if (bVar2) {
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
          return false;
        }
      }
      else if (PVar6 == WARN) {
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c8,(cmPolicies *)0x27,id_00);
        poVar9 = std::operator<<((ostream *)&e,(string *)&local_1c8);
        std::operator<<(poVar9,"\n");
        std::__cxx11::string::~string((string *)&local_1c8);
        bVar2 = false;
        pcVar11 = "should";
        t = AUTHOR_WARNING;
        goto LAB_002cef15;
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    }
    else if (pcVar8->TargetTypeValue == OBJECT_LIBRARY) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar9 = std::operator<<((ostream *)&e,"Object library target \"");
      poVar9 = std::operator<<(poVar9,(string *)
                                      (args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start);
      poVar9 = std::operator<<(poVar9,"\" ");
      std::operator<<(poVar9,"may not link to anything.");
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c8);
      goto LAB_002cf42c;
    }
    pbVar12 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pbVar10 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (0x20 < (ulong)((long)pbVar10 - (long)pbVar12)) {
      this->CurrentProcessingState = ProcessingLinkLibraries;
      llt = GENERAL;
      bVar2 = false;
      uVar14 = 1;
      do {
        if ((ulong)((long)pbVar10 - (long)pbVar12 >> 5) <= uVar14) {
          if (bVar2) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
            poVar9 = std::operator<<((ostream *)&e,"The \"");
            poVar9 = std::operator<<(poVar9,LinkLibraryTypeNames[llt]);
            std::operator<<(poVar9,"\" argument must be followed by a library.");
            pcVar1 = (this->super_cmCommand).Makefile;
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c8);
            std::__cxx11::string::~string((string *)&local_1c8);
            cmSystemTools::s_FatalErrorOccured = true;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
          }
          PVar6 = cmTarget::GetPolicyStatusCMP0022(this->Target);
          if (WARN < PVar6) {
            return true;
          }
          if (this->CurrentProcessingState == ProcessingLinkLibraries) {
            return true;
          }
          pcVar8 = this->Target;
          std::__cxx11::string::string
                    ((string *)&e,"LINK_INTERFACE_LIBRARIES",(allocator *)&local_1c8);
          pcVar11 = cmTarget::GetProperty(pcVar8,(string *)&e);
          std::__cxx11::string::~string((string *)&e);
          if (pcVar11 != (char *)0x0) {
            return true;
          }
          pcVar8 = this->Target;
          std::__cxx11::string::string
                    ((string *)&e,"LINK_INTERFACE_LIBRARIES",(allocator *)&local_1c8);
          cmTarget::SetProperty(pcVar8,(string *)&e,"");
LAB_002cf48b:
          std::__cxx11::string::~string((string *)&e);
          return true;
        }
        bVar3 = std::operator==(pbVar12 + uVar14,"LINK_INTERFACE_LIBRARIES");
        iVar13 = (int)uVar14;
        if (bVar3) {
          this->CurrentProcessingState = ProcessingPlainLinkInterface;
          if (iVar13 != 1) {
            pcVar1 = (this->super_cmCommand).Makefile;
            std::__cxx11::string::string
                      ((string *)&e,
                       "The LINK_INTERFACE_LIBRARIES option must appear as the second argument, just after the target name."
                       ,(allocator *)&local_1c8);
            cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&e);
            goto LAB_002cf48b;
          }
        }
        else {
          bVar3 = std::operator==((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar14,"INTERFACE");
          if (bVar3) {
            if ((iVar13 != 1) &&
               ((ProcessingKeywordPrivateInterface < this->CurrentProcessingState ||
                ((0x54U >> (this->CurrentProcessingState & 0x1f) & 1) == 0)))) {
              pcVar1 = (this->super_cmCommand).Makefile;
              std::__cxx11::string::string
                        ((string *)&e,
                         "The INTERFACE option must appear as the second argument, just after the target name."
                         ,(allocator *)&local_1c8);
              cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&e);
              goto LAB_002cf48b;
            }
            this->CurrentProcessingState = ProcessingKeywordLinkInterface;
          }
          else {
            bVar3 = std::operator==((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar14,
                                    "LINK_PUBLIC");
            if (bVar3) {
              if (((iVar13 != 1) && (this->CurrentProcessingState != ProcessingPlainPublicInterface)
                  ) && (this->CurrentProcessingState != ProcessingPlainPrivateInterface)) {
                pcVar1 = (this->super_cmCommand).Makefile;
                std::__cxx11::string::string
                          ((string *)&e,
                           "The LINK_PUBLIC or LINK_PRIVATE option must appear as the second argument, just after the target name."
                           ,(allocator *)&local_1c8);
                cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&e);
                goto LAB_002cf48b;
              }
              this->CurrentProcessingState = ProcessingPlainPublicInterface;
            }
            else {
              bVar3 = std::operator==((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar14,"PUBLIC");
              if (bVar3) {
                if ((iVar13 != 1) &&
                   ((ProcessingKeywordPrivateInterface < this->CurrentProcessingState ||
                    ((0x54U >> (this->CurrentProcessingState & 0x1f) & 1) == 0)))) {
                  pcVar1 = (this->super_cmCommand).Makefile;
                  std::__cxx11::string::string
                            ((string *)&e,
                             "The PUBLIC or PRIVATE option must appear as the second argument, just after the target name."
                             ,(allocator *)&local_1c8);
                  cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&e);
                  goto LAB_002cf48b;
                }
                this->CurrentProcessingState = ProcessingKeywordPublicInterface;
              }
              else {
                bVar3 = std::operator==((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar14,
                                        "LINK_PRIVATE");
                if (bVar3) {
                  if (((iVar13 != 1) &&
                      (this->CurrentProcessingState != ProcessingPlainPublicInterface)) &&
                     (this->CurrentProcessingState != ProcessingPlainPrivateInterface)) {
                    pcVar1 = (this->super_cmCommand).Makefile;
                    std::__cxx11::string::string
                              ((string *)&e,
                               "The LINK_PUBLIC or LINK_PRIVATE option must appear as the second argument, just after the target name."
                               ,(allocator *)&local_1c8);
                    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&e);
                    goto LAB_002cf48b;
                  }
                  this->CurrentProcessingState = ProcessingPlainPrivateInterface;
                }
                else {
                  bVar3 = std::operator==((args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + uVar14,
                                          "PRIVATE");
                  if (bVar3) {
                    if ((iVar13 != 1) &&
                       ((ProcessingKeywordPrivateInterface < this->CurrentProcessingState ||
                        ((0x54U >> (this->CurrentProcessingState & 0x1f) & 1) == 0)))) {
                      pcVar1 = (this->super_cmCommand).Makefile;
                      std::__cxx11::string::string
                                ((string *)&e,
                                 "The PUBLIC or PRIVATE option must appear as the second argument, just after the target name."
                                 ,(allocator *)&local_1c8);
                      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&e);
                      goto LAB_002cf48b;
                    }
                    this->CurrentProcessingState = ProcessingKeywordPrivateInterface;
                  }
                  else {
                    bVar3 = std::operator==((args->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start + uVar14,
                                            "debug");
                    if (bVar3) {
                      if (bVar2) {
                        right = DEBUG;
LAB_002cf19b:
                        LinkLibraryTypeSpecifierWarning(this,llt,right);
                        llt = right;
                      }
                      else {
                        llt = DEBUG;
                      }
                    }
                    else {
                      bVar3 = std::operator==((args->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start + uVar14,
                                              "optimized");
                      if (bVar3) {
                        if (bVar2) {
                          right = OPTIMIZED;
                          goto LAB_002cf19b;
                        }
                        llt = OPTIMIZED;
                      }
                      else {
                        bVar3 = std::operator==((args->
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start + uVar14,
                                                "general");
                        if (!bVar3) {
                          if (bVar2) {
                            bVar3 = HandleLibrary(this,(args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar14,llt);
                            bVar2 = false;
                            if (!bVar3) {
                              return false;
                            }
                          }
                          else {
                            std::__cxx11::string::string
                                      ((string *)&e,
                                       (string *)
                                       (args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start);
                            std::__cxx11::string::append((char *)&e);
                            pcVar11 = cmMakefile::GetDefinition
                                                ((this->super_cmCommand).Makefile,(string *)&e);
                            if (pcVar11 == (char *)0x0) {
                              llt = GENERAL;
                            }
                            else {
                              iVar4 = strcmp(pcVar11,"debug");
                              iVar5 = strcmp(pcVar11,"optimized");
                              llt = OPTIMIZED;
                              if (iVar5 != 0) {
                                llt = (LinkLibraryType)(iVar4 == 0);
                              }
                            }
                            bVar3 = HandleLibrary(this,(args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar14,llt);
                            std::__cxx11::string::~string((string *)&e);
                            if (!bVar3) {
                              return false;
                            }
                          }
                          goto LAB_002cf1eb;
                        }
                        if (bVar2) {
                          LinkLibraryTypeSpecifierWarning(this,llt,0);
                        }
                        llt = GENERAL;
                      }
                    }
                    bVar2 = true;
                  }
                }
              }
            }
          }
        }
LAB_002cf1eb:
        uVar14 = (ulong)(iVar13 + 1);
        pbVar12 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pbVar10 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      } while( true );
    }
  }
  return true;
}

Assistant:

bool cmTargetLinkLibrariesCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  // must have one argument
  if(args.size() < 1)
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  if (this->Makefile->IsAlias(args[0]))
    {
    this->SetError("can not be used on an ALIAS target.");
    return false;
    }
  // Lookup the target for which libraries are specified.
  this->Target =
    this->Makefile->GetCMakeInstance()
    ->GetGlobalGenerator()->FindTarget(args[0]);
  if(!this->Target)
    {
    cmake::MessageType t = cmake::FATAL_ERROR;  // fail by default
    std::ostringstream e;
    e << "Cannot specify link libraries for target \"" << args[0] << "\" "
      << "which is not built by this project.";
    // The bad target is the only argument. Check how policy CMP0016 is set,
    // and accept, warn or fail respectively:
    if (args.size() < 2)
      {
      switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0016))
        {
        case cmPolicies::WARN:
          t = cmake::AUTHOR_WARNING;
          // Print the warning.
          e << "\n"
            << "CMake does not support this but it used to work accidentally "
            << "and is being allowed for compatibility."
            << "\n" << cmPolicies::GetPolicyWarning(cmPolicies::CMP0016);
           break;
        case cmPolicies::OLD:          // OLD behavior does not warn.
          t = cmake::MESSAGE;
          break;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
          e << "\n" << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0016);
          break;
        case cmPolicies::NEW:  // NEW behavior prints the error.
          break;
        }
      }

    // now actually print the message
    switch(t)
      {
      case cmake::AUTHOR_WARNING:
        this->Makefile->IssueMessage(cmake::AUTHOR_WARNING, e.str());
        break;
      case cmake::FATAL_ERROR:
        this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
        cmSystemTools::SetFatalErrorOccured();
        break;
      default:
        break;
      }
    return true;
    }

  if(this->Target->GetType() == cmTarget::OBJECT_LIBRARY)
    {
    std::ostringstream e;
    e << "Object library target \"" << args[0] << "\" "
      << "may not link to anything.";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    cmSystemTools::SetFatalErrorOccured();
    return true;
    }

  if (this->Target->GetType() == cmTarget::UTILITY)
    {
    std::ostringstream e;
    const char *modal = 0;
    cmake::MessageType messageType = cmake::AUTHOR_WARNING;
    switch(this->Makefile->GetPolicyStatus(cmPolicies::CMP0039))
      {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0039) << "\n";
        modal = "should";
      case cmPolicies::OLD:
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        modal = "must";
        messageType = cmake::FATAL_ERROR;
      }
    if (modal)
      {
      e <<
        "Utility target \"" << this->Target->GetName() << "\" " << modal
        << " not be used as the target of a target_link_libraries call.";
      this->Makefile->IssueMessage(messageType, e.str());
      if(messageType == cmake::FATAL_ERROR)
        {
        return false;
        }
      }
    }

  // but we might not have any libs after variable expansion
  if(args.size() < 2)
    {
    return true;
    }

  // Keep track of link configuration specifiers.
  cmTarget::LinkLibraryType llt = cmTarget::GENERAL;
  bool haveLLT = false;

  // Start with primary linking and switch to link interface
  // specification if the keyword is encountered as the first argument.
  this->CurrentProcessingState = ProcessingLinkLibraries;

  // add libraries, note that there is an optional prefix
  // of debug and optimized that can be used
  for(unsigned int i=1; i < args.size(); ++i)
    {
    if(args[i] == "LINK_INTERFACE_LIBRARIES")
      {
      this->CurrentProcessingState = ProcessingPlainLinkInterface;
      if(i != 1)
        {
        this->Makefile->IssueMessage(
          cmake::FATAL_ERROR,
          "The LINK_INTERFACE_LIBRARIES option must appear as the second "
          "argument, just after the target name."
          );
        return true;
        }
      }
    else if(args[i] == "INTERFACE")
      {
      if(i != 1
          && this->CurrentProcessingState != ProcessingKeywordPrivateInterface
          && this->CurrentProcessingState != ProcessingKeywordPublicInterface
          && this->CurrentProcessingState != ProcessingKeywordLinkInterface)
        {
        this->Makefile->IssueMessage(
          cmake::FATAL_ERROR,
          "The INTERFACE option must appear as the second "
          "argument, just after the target name."
          );
        return true;
        }
      this->CurrentProcessingState = ProcessingKeywordLinkInterface;
      }
    else if(args[i] == "LINK_PUBLIC")
      {
      if(i != 1
          && this->CurrentProcessingState != ProcessingPlainPrivateInterface
          && this->CurrentProcessingState != ProcessingPlainPublicInterface)
        {
        this->Makefile->IssueMessage(
          cmake::FATAL_ERROR,
          "The LINK_PUBLIC or LINK_PRIVATE option must appear as the second "
          "argument, just after the target name."
          );
        return true;
        }
      this->CurrentProcessingState = ProcessingPlainPublicInterface;
      }
    else if(args[i] == "PUBLIC")
      {
      if(i != 1
          && this->CurrentProcessingState != ProcessingKeywordPrivateInterface
          && this->CurrentProcessingState != ProcessingKeywordPublicInterface
          && this->CurrentProcessingState != ProcessingKeywordLinkInterface)
        {
        this->Makefile->IssueMessage(
          cmake::FATAL_ERROR,
          "The PUBLIC or PRIVATE option must appear as the second "
          "argument, just after the target name."
          );
        return true;
        }
      this->CurrentProcessingState = ProcessingKeywordPublicInterface;
      }
    else if(args[i] == "LINK_PRIVATE")
      {
      if(i != 1
          && this->CurrentProcessingState != ProcessingPlainPublicInterface
          && this->CurrentProcessingState != ProcessingPlainPrivateInterface)
        {
        this->Makefile->IssueMessage(
          cmake::FATAL_ERROR,
          "The LINK_PUBLIC or LINK_PRIVATE option must appear as the second "
          "argument, just after the target name."
          );
        return true;
        }
      this->CurrentProcessingState = ProcessingPlainPrivateInterface;
      }
    else if(args[i] == "PRIVATE")
      {
      if(i != 1
          && this->CurrentProcessingState != ProcessingKeywordPrivateInterface
          && this->CurrentProcessingState != ProcessingKeywordPublicInterface
          && this->CurrentProcessingState != ProcessingKeywordLinkInterface)
        {
        this->Makefile->IssueMessage(
          cmake::FATAL_ERROR,
          "The PUBLIC or PRIVATE option must appear as the second "
          "argument, just after the target name."
          );
        return true;
        }
      this->CurrentProcessingState = ProcessingKeywordPrivateInterface;
      }
    else if(args[i] == "debug")
      {
      if(haveLLT)
        {
        this->LinkLibraryTypeSpecifierWarning(llt, cmTarget::DEBUG);
        }
      llt = cmTarget::DEBUG;
      haveLLT = true;
      }
    else if(args[i] == "optimized")
      {
      if(haveLLT)
        {
        this->LinkLibraryTypeSpecifierWarning(llt, cmTarget::OPTIMIZED);
        }
      llt = cmTarget::OPTIMIZED;
      haveLLT = true;
      }
    else if(args[i] == "general")
      {
      if(haveLLT)
        {
        this->LinkLibraryTypeSpecifierWarning(llt, cmTarget::GENERAL);
        }
      llt = cmTarget::GENERAL;
      haveLLT = true;
      }
    else if(haveLLT)
      {
      // The link type was specified by the previous argument.
      haveLLT = false;
      if (!this->HandleLibrary(args[i], llt))
        {
        return false;
        }
      }
    else
      {
      // Lookup old-style cache entry if type is unspecified.  So if you
      // do a target_link_libraries(foo optimized bar) it will stay optimized
      // and not use the lookup.  As there maybe the case where someone has
      // specifed that a library is both debug and optimized.  (this check is
      // only there for backwards compatibility when mixing projects built
      // with old versions of CMake and new)
      llt = cmTarget::GENERAL;
      std::string linkType = args[0];
      linkType += "_LINK_TYPE";
      const char* linkTypeString =
        this->Makefile->GetDefinition( linkType );
      if(linkTypeString)
        {
        if(strcmp(linkTypeString, "debug") == 0)
          {
          llt = cmTarget::DEBUG;
          }
        if(strcmp(linkTypeString, "optimized") == 0)
          {
          llt = cmTarget::OPTIMIZED;
          }
        }
      if (!this->HandleLibrary(args[i], llt))
        {
        return false;
        }
      }
    }

  // Make sure the last argument was not a library type specifier.
  if(haveLLT)
    {
    std::ostringstream e;
    e << "The \"" << this->LinkLibraryTypeNames[llt]
      << "\" argument must be followed by a library.";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    cmSystemTools::SetFatalErrorOccured();
    }

  const cmPolicies::PolicyStatus policy22Status
                      = this->Target->GetPolicyStatusCMP0022();

  // If any of the LINK_ options were given, make sure the
  // LINK_INTERFACE_LIBRARIES target property exists.
  // Use of any of the new keywords implies awareness of
  // this property. And if no libraries are named, it should
  // result in an empty link interface.
  if((policy22Status == cmPolicies::OLD ||
      policy22Status == cmPolicies::WARN) &&
      this->CurrentProcessingState != ProcessingLinkLibraries &&
     !this->Target->GetProperty("LINK_INTERFACE_LIBRARIES"))
    {
    this->Target->SetProperty("LINK_INTERFACE_LIBRARIES", "");
    }

  return true;
}